

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCB.cpp
# Opt level: O0

void print_pcbs(list<PCB_*,_std::allocator<PCB_*>_> *p)

{
  bool bVar1;
  reference ppPVar2;
  void *pvVar3;
  ostream *poVar4;
  string local_50 [8];
  string s;
  PCB *pcb;
  iterator __end1;
  iterator __begin1;
  list<PCB_*,_std::allocator<PCB_*>_> *__range1;
  list<PCB_*,_std::allocator<PCB_*>_> *p_local;
  
  __end1 = std::__cxx11::list<PCB_*,_std::allocator<PCB_*>_>::begin(p);
  pcb = (PCB *)std::__cxx11::list<PCB_*,_std::allocator<PCB_*>_>::end(p);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&pcb), bVar1) {
    ppPVar2 = std::_List_iterator<PCB_*>::operator*(&__end1);
    s.field_2._8_8_ = *ppPVar2;
    poVar4 = std::operator<<((ostream *)&std::cout,"ID\t");
    pvVar3 = (void *)std::ostream::operator<<(poVar4,*(int *)s.field_2._8_8_);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"Job Size:\t");
    pvVar3 = (void *)std::ostream::operator<<(poVar4,*(int *)(s.field_2._8_8_ + 4));
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"JobPri:\t");
    pvVar3 = (void *)std::ostream::operator<<(poVar4,*(int *)(s.field_2._8_8_ + 8));
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"InSize:\t");
    pvVar3 = (void *)std::ostream::operator<<(poVar4,*(int *)(s.field_2._8_8_ + 0xc));
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"OutSize:\t");
    pvVar3 = (void *)std::ostream::operator<<(poVar4,*(int *)(s.field_2._8_8_ + 0x10));
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"TempSize:\t");
    pvVar3 = (void *)std::ostream::operator<<(poVar4,*(int *)(s.field_2._8_8_ + 0x14));
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"Total Size:\t");
    pvVar3 = (void *)std::ostream::operator<<(poVar4,*(int *)(s.field_2._8_8_ + 0x18));
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::string(local_50);
    switch(*(undefined4 *)(s.field_2._8_8_ + 0x1c)) {
    case 0:
      std::__cxx11::string::operator=(local_50,"RUNNING");
      break;
    case 1:
      std::__cxx11::string::operator=(local_50,"READY");
      break;
    case 2:
      std::__cxx11::string::operator=(local_50,"BLOCKED");
      break;
    case 3:
      std::__cxx11::string::operator=(local_50,"NEW");
      break;
    case 4:
      std::__cxx11::string::operator=(local_50,"COMPLETED");
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"State:\t");
    poVar4 = std::operator<<(poVar4,local_50);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_50);
    std::_List_iterator<PCB_*>::operator++(&__end1);
  }
  bVar1 = std::__cxx11::list<PCB_*,_std::allocator<PCB_*>_>::empty(p);
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"No PCBs to print.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void print_pcbs(std::list<PCB *> p)
{

    for(PCB *pcb : p)
    {
        std::cout << "ID\t" << pcb->job_id << std::endl;
        std::cout << "Job Size:\t" << pcb->job_size << std::endl;
        std::cout << "JobPri:\t" << pcb->job_pri << std::endl;
        std::cout << "InSize:\t" << pcb->in_buf_size << std::endl;
        std::cout << "OutSize:\t" << pcb->out_buf_size << std::endl;
        std::cout << "TempSize:\t" << pcb->temp_buf_size << std::endl;
        std::cout << "Total Size:\t" << pcb->total_size << std::endl;
        std::string s;
        switch((int)pcb->state)
        {
            case 0: {
                s = "RUNNING";
                break;
            }
            case 1: {
                s = "READY";
                break;
            }
            case 2: {
                s = "BLOCKED";
                break;
            }
            case 3: {
                s = "NEW";
                break;
            }
            case 4: {
                s = "COMPLETED";
                break;
            }
        }
        std::cout << "State:\t" << s << std::endl;
        std::cout << std::endl;
    }

    if (p.empty())
        std::cout << ("No PCBs to print.") << std::endl;

}